

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::AddCompileOptions
          (cmLocalGenerator *this,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *flags,cmGeneratorTarget *target,string *lang,string *config)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer *ppBVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  cmValue lang_00;
  bool bVar2;
  ManagedType MVar3;
  char *pcVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  ostream *poVar5;
  cmake *this_02;
  cmMakefile *pcVar6;
  string *psVar7;
  container_type *options_vec;
  ulong uVar8;
  string_view val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_678;
  undefined1 local_4f8 [8];
  string jmcFlags;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  iterator local_4b0;
  size_type local_4a8;
  undefined1 local_4a0 [8];
  cmList optList;
  string local_478;
  string local_458;
  undefined1 local_438 [8];
  string isJMCEnabled;
  string local_410;
  cmValue local_3f0;
  cmValue jmcExprGen;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  cmValue local_3a8;
  cmValue jmc;
  cmMakefile *mf;
  string wErrorFlags;
  cmValue local_358;
  cmValue wErrorOpts;
  string local_348;
  cmValue local_328;
  cmValue wError;
  string local_318;
  undefined1 local_2f8 [8];
  ostringstream e;
  cmValue local_180;
  cmValue standard;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *it;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  cmStandardLevelResolver standardResolver;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  targetCompileOpts_1;
  string compileFlags;
  string local_110;
  cmValue local_f0;
  cmValue targetFlags_1;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  targetCompileOpts;
  string compileOpts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  opts;
  string local_90;
  cmValue local_70;
  cmValue targetFlags;
  cmValue local_58;
  cmValue langFlagRegexStr;
  string langFlagRegexVar;
  string *config_local;
  string *lang_local;
  cmGeneratorTarget *target_local;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *flags_local;
  cmLocalGenerator *this_local;
  
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[12]>
            ((string *)&langFlagRegexStr,(char (*) [7])0x104930a,lang,(char (*) [12])"_FLAG_REGEX");
  local_58 = cmMakefile::GetDefinition(this->Makefile,(string *)&langFlagRegexStr);
  bVar2 = cmValue::operator_cast_to_bool(&local_58);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"COMPILE_FLAGS",
               (allocator<char> *)
               ((long)&opts.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_70 = cmGeneratorTarget::GetProperty(target,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&opts.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    bVar2 = cmValue::operator_cast_to_bool(&local_70);
    if (bVar2) {
      this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&compileOpts.field_2 + 8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(this_00);
      cmValue::operator->[abi_cxx11_(&local_70);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::ParseWindowsCommandLine(pcVar4,this_00);
      ppBVar1 = &targetCompileOpts.
                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::string((string *)ppBVar1);
      cmValue::operator->[abi_cxx11_(&local_58);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      AppendCompileOptions
                (this,(string *)ppBVar1,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&compileOpts.field_2 + 8),pcVar4);
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                   flags,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &targetCompileOpts.
                          super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      std::__cxx11::string::~string
                ((string *)
                 &targetCompileOpts.
                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&compileOpts.field_2 + 8));
    }
    cmGeneratorTarget::GetCompileOptions
              ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&targetFlags_1,target,config,lang);
    cmValue::operator->[abi_cxx11_(&local_58);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    AppendCompileOptions
              (this,flags,
               (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&targetFlags_1,pcVar4);
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&targetFlags_1);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"COMPILE_FLAGS",
               (allocator<char> *)(compileFlags.field_2._M_local_buf + 0xf));
    local_f0 = cmGeneratorTarget::GetProperty(target,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator((allocator<char> *)(compileFlags.field_2._M_local_buf + 0xf));
    bVar2 = cmValue::operator_cast_to_bool(&local_f0);
    if (bVar2) {
      ppBVar1 = &targetCompileOpts_1.
                 super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::string((string *)ppBVar1);
      psVar7 = cmValue::operator*[abi_cxx11_(&local_f0);
      (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[7])(this,ppBVar1,psVar7);
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                   flags,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &targetCompileOpts_1.
                          super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      std::__cxx11::string::~string
                ((string *)
                 &targetCompileOpts_1.
                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    cmGeneratorTarget::GetCompileOptions
              ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&standardResolver,target,config,lang);
    AppendCompileOptions
              (this,flags,
               (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&standardResolver,(char *)0x0);
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&standardResolver);
  }
  cmStandardLevelResolver::cmStandardLevelResolver
            ((cmStandardLevelResolver *)&__range1,this->Makefile);
  this_01 = cmGeneratorTarget::GetMaxLanguageStandards_abi_cxx11_(target);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(this_01);
  it = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::end(this_01);
  do {
    bVar2 = std::operator!=(&__end1,(_Self *)&it);
    if (!bVar2) {
      this_02 = GetCMakeInstance(this);
      bVar2 = cmake::GetIgnoreWarningAsError(this_02);
      if (!bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_348,"COMPILE_WARNING_AS_ERROR",
                   (allocator<char> *)((long)&wErrorOpts.Value + 7));
        local_328 = cmGeneratorTarget::GetProperty(target,&local_348);
        std::__cxx11::string::~string((string *)&local_348);
        std::allocator<char>::~allocator((allocator<char> *)((long)&wErrorOpts.Value + 7));
        pcVar6 = this->Makefile;
        cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[34]>
                  ((string *)((long)&wErrorFlags.field_2 + 8),(char (*) [7])0x104930a,lang,
                   (char (*) [34])"_COMPILE_OPTIONS_WARNING_AS_ERROR");
        local_358 = cmMakefile::GetDefinition(pcVar6,(string *)((long)&wErrorFlags.field_2 + 8));
        std::__cxx11::string::~string((string *)(wErrorFlags.field_2._M_local_buf + 8));
        bVar2 = cmValue::IsOn(&local_328);
        if ((bVar2) && (bVar2 = cmValue::IsSet(&local_358), bVar2)) {
          std::__cxx11::string::string((string *)&mf);
          psVar7 = cmValue::operator*[abi_cxx11_(&local_358);
          AppendCompileOptions(this,(string *)&mf,psVar7,(char *)0x0);
          uVar8 = std::__cxx11::string::empty();
          if ((uVar8 & 1) == 0) {
            std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
            emplace_back<std::__cxx11::string>
                      ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                       flags,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &mf);
          }
          std::__cxx11::string::~string((string *)&mf);
        }
      }
      pcVar6 = GetMakefile(this);
      jmc.Value = (string *)pcVar6;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &jmcExprGen,"CMAKE_",lang);
      std::operator+(&local_3c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &jmcExprGen,"_COMPILE_OPTIONS_JMC");
      local_3a8 = cmMakefile::GetDefinition(pcVar6,&local_3c8);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::__cxx11::string::~string((string *)&jmcExprGen);
      bVar2 = cmValue::operator_cast_to_bool(&local_3a8);
      if ((bVar2) && (MVar3 = cmGeneratorTarget::GetManagedType(target,config), MVar3 != Managed)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_410,"VS_JUST_MY_CODE_DEBUGGING",
                   (allocator<char> *)(isJMCEnabled.field_2._M_local_buf + 0xf));
        local_3f0 = cmGeneratorTarget::GetProperty(target,&local_410);
        std::__cxx11::string::~string((string *)&local_410);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(isJMCEnabled.field_2._M_local_buf + 0xf));
        bVar2 = cmValue::operator_cast_to_bool(&local_3f0);
        if (bVar2) {
          psVar7 = cmValue::operator*[abi_cxx11_(&local_3f0);
          std::__cxx11::string::string((string *)&local_458,(string *)psVar7);
          std::__cxx11::string::string((string *)&local_478);
          cmGeneratorExpression::Evaluate
                    ((string *)local_438,&local_458,this,config,(cmGeneratorTarget *)0x0,
                     (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,&local_478);
          std::__cxx11::string::~string((string *)&local_478);
          std::__cxx11::string::~string((string *)&local_458);
          val = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_438);
          optList.Values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)val._M_len;
          bVar2 = cmIsOn(val);
          if (bVar2) {
            jmcFlags.field_2._8_8_ = &local_4d0;
            psVar7 = cmValue::operator*[abi_cxx11_(&local_3a8);
            std::__cxx11::string::string((string *)&local_4d0,(string *)psVar7);
            local_4b0 = &local_4d0;
            local_4a8 = 1;
            init._M_len = 1;
            init._M_array = local_4b0;
            cmList::cmList((cmList *)local_4a0,init);
            local_678 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_4b0;
            do {
              local_678 = local_678 + -1;
              std::__cxx11::string::~string((string *)local_678);
            } while (local_678 != &local_4d0);
            std::__cxx11::string::string((string *)local_4f8);
            options_vec = cmList::operator_cast_to_vector_((cmList *)local_4a0);
            AppendCompileOptions(this,(string *)local_4f8,options_vec,(char *)0x0);
            uVar8 = std::__cxx11::string::empty();
            if ((uVar8 & 1) == 0) {
              std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
              emplace_back<std::__cxx11::string>
                        ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>
                          *)flags,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_4f8);
            }
            std::__cxx11::string::~string((string *)local_4f8);
            cmList::~cmList((cmList *)local_4a0);
          }
          std::__cxx11::string::~string((string *)local_438);
        }
      }
      wError.Value._4_4_ = 0;
LAB_0036abba:
      std::__cxx11::string::~string((string *)&langFlagRegexStr);
      return;
    }
    standard.Value =
         &std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator*(&__end1)->first;
    local_180 = cmGeneratorTarget::GetLanguageStandard(target,standard.Value,config);
    bVar2 = cmValue::operator_cast_to_bool(&local_180);
    lang_00 = standard;
    if (bVar2) {
      psVar7 = cmValue::operator*[abi_cxx11_(&local_180);
      bVar2 = cmStandardLevelResolver::IsLaterStandard
                        ((cmStandardLevelResolver *)&__range1,lang_00.Value,psVar7,
                         standard.Value + 1);
      if (bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
        poVar5 = std::operator<<((ostream *)local_2f8,"The COMPILE_FEATURES property of target \"");
        psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(target);
        poVar5 = std::operator<<(poVar5,(string *)psVar7);
        poVar5 = std::operator<<(poVar5,
                                 "\" was evaluated when computing the link implementation, and the \""
                                );
        poVar5 = std::operator<<(poVar5,(string *)standard.Value);
        poVar5 = std::operator<<(poVar5,"_STANDARD\" was \"");
        poVar5 = std::operator<<(poVar5,(string *)(standard.Value + 1));
        poVar5 = std::operator<<(poVar5,
                                 "\" for that computation.  Computing the COMPILE_FEATURES based on the link implementation resulted in a higher \""
                                );
        poVar5 = std::operator<<(poVar5,(string *)standard.Value);
        poVar5 = std::operator<<(poVar5,"_STANDARD\" \"");
        psVar7 = cmValue::operator*[abi_cxx11_(&local_180);
        poVar5 = std::operator<<(poVar5,(string *)psVar7);
        std::operator<<(poVar5,
                        "\".  This is not permitted. The COMPILE_FEATURES may not both depend on and be depended on by the link implementation.\n"
                       );
        std::__cxx11::ostringstream::str();
        IssueMessage(this,FATAL_ERROR,&local_318);
        std::__cxx11::string::~string((string *)&local_318);
        wError.Value._4_4_ = 1;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f8);
        goto LAB_0036abba;
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void cmLocalGenerator::AddCompileOptions(std::vector<BT<std::string>>& flags,
                                         cmGeneratorTarget* target,
                                         const std::string& lang,
                                         const std::string& config)
{
  std::string langFlagRegexVar = cmStrCat("CMAKE_", lang, "_FLAG_REGEX");

  if (cmValue langFlagRegexStr =
        this->Makefile->GetDefinition(langFlagRegexVar)) {
    // Filter flags acceptable to this language.
    if (cmValue targetFlags = target->GetProperty("COMPILE_FLAGS")) {
      std::vector<std::string> opts;
      cmSystemTools::ParseWindowsCommandLine(targetFlags->c_str(), opts);
      // Re-escape these flags since COMPILE_FLAGS were already parsed
      // as a command line above.
      std::string compileOpts;
      this->AppendCompileOptions(compileOpts, opts, langFlagRegexStr->c_str());
      if (!compileOpts.empty()) {
        flags.emplace_back(std::move(compileOpts));
      }
    }
    std::vector<BT<std::string>> targetCompileOpts =
      target->GetCompileOptions(config, lang);
    // COMPILE_OPTIONS are escaped.
    this->AppendCompileOptions(flags, targetCompileOpts,
                               langFlagRegexStr->c_str());
  } else {
    // Use all flags.
    if (cmValue targetFlags = target->GetProperty("COMPILE_FLAGS")) {
      // COMPILE_FLAGS are not escaped for historical reasons.
      std::string compileFlags;
      this->AppendFlags(compileFlags, *targetFlags);
      if (!compileFlags.empty()) {
        flags.emplace_back(std::move(compileFlags));
      }
    }
    std::vector<BT<std::string>> targetCompileOpts =
      target->GetCompileOptions(config, lang);
    // COMPILE_OPTIONS are escaped.
    this->AppendCompileOptions(flags, targetCompileOpts);
  }

  cmStandardLevelResolver standardResolver(this->Makefile);
  for (auto const& it : target->GetMaxLanguageStandards()) {
    cmValue standard = target->GetLanguageStandard(it.first, config);
    if (!standard) {
      continue;
    }
    if (standardResolver.IsLaterStandard(it.first, *standard, it.second)) {
      std::ostringstream e;
      e << "The COMPILE_FEATURES property of target \"" << target->GetName()
        << "\" was evaluated when computing the link "
           "implementation, and the \""
        << it.first << "_STANDARD\" was \"" << it.second
        << "\" for that computation.  Computing the "
           "COMPILE_FEATURES based on the link implementation resulted in a "
           "higher \""
        << it.first << "_STANDARD\" \"" << *standard
        << "\".  "
           "This is not permitted. The COMPILE_FEATURES may not both depend "
           "on "
           "and be depended on by the link implementation.\n";
      this->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return;
    }
  }

  // Add Warning as errors flags
  if (!this->GetCMakeInstance()->GetIgnoreWarningAsError()) {
    const cmValue wError = target->GetProperty("COMPILE_WARNING_AS_ERROR");
    const cmValue wErrorOpts = this->Makefile->GetDefinition(
      cmStrCat("CMAKE_", lang, "_COMPILE_OPTIONS_WARNING_AS_ERROR"));
    if (wError.IsOn() && wErrorOpts.IsSet()) {
      std::string wErrorFlags;
      this->AppendCompileOptions(wErrorFlags, *wErrorOpts);
      if (!wErrorFlags.empty()) {
        flags.emplace_back(std::move(wErrorFlags));
      }
    }
  }

  // Add compile flag for the MSVC compiler only.
  cmMakefile* mf = this->GetMakefile();
  if (cmValue jmc =
        mf->GetDefinition("CMAKE_" + lang + "_COMPILE_OPTIONS_JMC")) {

    // Handle Just My Code debugging flags, /JMC.
    // If the target is a Managed C++ one, /JMC is not compatible.
    if (target->GetManagedType(config) !=
        cmGeneratorTarget::ManagedType::Managed) {
      // add /JMC flags if target property VS_JUST_MY_CODE_DEBUGGING is set
      // to ON
      if (cmValue jmcExprGen =
            target->GetProperty("VS_JUST_MY_CODE_DEBUGGING")) {
        std::string isJMCEnabled =
          cmGeneratorExpression::Evaluate(*jmcExprGen, this, config);
        if (cmIsOn(isJMCEnabled)) {
          cmList optList{ *jmc };
          std::string jmcFlags;
          this->AppendCompileOptions(jmcFlags, optList);
          if (!jmcFlags.empty()) {
            flags.emplace_back(std::move(jmcFlags));
          }
        }
      }
    }
  }
}